

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintGates(Abc_Ntk_t *pNtk,int fUseLibrary)

{
  Mio_Gate_t *pGate;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Mio_Gate_t **ppMVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  double dVar10;
  double dVar11;
  uint local_78;
  int local_74;
  int nGateNameLen;
  int i_1;
  int nGates;
  int Counter;
  double AreaTotal;
  double Area;
  Mio_Gate_t **ppGates;
  char *pSop;
  uint local_40;
  int CounterTotal;
  int CountOther;
  int CountOr;
  int CountAnd;
  int CountInv;
  int CountBuf;
  int CountConst;
  int i;
  int fHasBdds;
  Abc_Obj_t *pObj;
  int fUseLibrary_local;
  Abc_Ntk_t *pNtk_local;
  
  if ((fUseLibrary == 0) || (iVar1 = Abc_NtkHasMapping(pNtk), iVar1 == 0)) {
    iVar1 = Abc_NtkIsAigLogic(pNtk);
    if (iVar1 == 0) {
      iVar1 = Abc_NtkIsBddLogic(pNtk);
      if ((iVar1 == 0) || (iVar2 = Abc_NtkBddToSop(pNtk,-1,1000000000), iVar2 != 0)) {
        pSop._4_4_ = 0;
        local_40 = 0;
        CounterTotal = 0;
        CountOther = 0;
        CountOr = 0;
        CountAnd = 0;
        CountInv = 0;
        for (CountBuf = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), CountBuf < iVar2;
            CountBuf = CountBuf + 1) {
          pAVar6 = Abc_NtkObj(pNtk,CountBuf);
          if ((((pAVar6 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar6), iVar2 != 0)) &&
              (iVar2 = Abc_ObjIsBarBuf(pAVar6), iVar2 == 0)) && (CountBuf != 0)) {
            iVar2 = Abc_NtkHasMapping(pNtk);
            if (iVar2 == 0) {
              ppGates = (Mio_Gate_t **)(pAVar6->field_5).pData;
            }
            else {
              ppGates = (Mio_Gate_t **)Mio_GateReadSop((Mio_Gate_t *)(pAVar6->field_5).pData);
            }
            iVar2 = Abc_SopIsConst0((char *)ppGates);
            if ((iVar2 == 0) && (iVar2 = Abc_SopIsConst1((char *)ppGates), iVar2 == 0)) {
              iVar2 = Abc_SopIsBuf((char *)ppGates);
              if (iVar2 == 0) {
                iVar2 = Abc_SopIsInv((char *)ppGates);
                if (iVar2 == 0) {
                  iVar2 = Abc_SopIsComplement((char *)ppGates);
                  if (((iVar2 == 0) && (iVar2 = Abc_SopIsAndType((char *)ppGates), iVar2 != 0)) ||
                     ((iVar2 = Abc_SopIsComplement((char *)ppGates), iVar2 != 0 &&
                      (iVar2 = Abc_SopIsOrType((char *)ppGates), iVar2 != 0)))) {
                    CountOther = CountOther + 1;
                  }
                  else {
                    iVar2 = Abc_SopIsComplement((char *)ppGates);
                    if (((iVar2 == 0) || (iVar2 = Abc_SopIsAndType((char *)ppGates), iVar2 == 0)) &&
                       ((iVar2 = Abc_SopIsComplement((char *)ppGates), iVar2 != 0 ||
                        (iVar2 = Abc_SopIsOrType((char *)ppGates), iVar2 == 0)))) {
                      local_40 = local_40 + 1;
                    }
                    else {
                      CounterTotal = CounterTotal + 1;
                    }
                  }
                }
                else {
                  CountOr = CountOr + 1;
                }
              }
              else {
                CountAnd = CountAnd + 1;
              }
            }
            else {
              CountInv = CountInv + 1;
            }
            pSop._4_4_ = pSop._4_4_ + 1;
          }
        }
        printf("Const        = %8d    %6.2f %%\n",
               ((double)CountInv * 100.0) / (double)(int)pSop._4_4_,(ulong)(uint)CountInv);
        printf("Buffer       = %8d    %6.2f %%\n",
               ((double)CountAnd * 100.0) / (double)(int)pSop._4_4_,(ulong)(uint)CountAnd);
        printf("Inverter     = %8d    %6.2f %%\n",
               ((double)CountOr * 100.0) / (double)(int)pSop._4_4_,(ulong)(uint)CountOr);
        printf("And          = %8d    %6.2f %%\n",
               ((double)CountOther * 100.0) / (double)(int)pSop._4_4_,(ulong)(uint)CountOther);
        printf("Or           = %8d    %6.2f %%\n",
               ((double)CounterTotal * 100.0) / (double)(int)pSop._4_4_,(ulong)(uint)CounterTotal);
        printf("Other        = %8d    %6.2f %%\n",
               ((double)(int)local_40 * 100.0) / (double)(int)pSop._4_4_,(ulong)local_40);
        printf("TOTAL        = %8d    %6.2f %%\n",
               ((double)(int)pSop._4_4_ * 100.0) / (double)(int)pSop._4_4_,(ulong)pSop._4_4_);
        if (iVar1 != 0) {
          Abc_NtkSopToBdd(pNtk);
        }
      }
      else {
        printf("Abc_NtkPrintGates(): Converting to SOPs has failed.\n");
      }
    }
  }
  else {
    iVar1 = Mio_LibraryReadGateNum((Mio_Library_t *)pNtk->pManFunc);
    ppMVar5 = Mio_LibraryReadGateArray((Mio_Library_t *)pNtk->pManFunc);
    for (local_74 = 0; local_74 < iVar1; local_74 = local_74 + 1) {
      Mio_GateSetValue(ppMVar5[local_74],0);
    }
    pSop._4_4_ = 0;
    for (local_74 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_74 < iVar2; local_74 = local_74 + 1)
    {
      pAVar6 = Abc_NtkObj(pNtk,local_74);
      if ((((pAVar6 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar6), iVar2 != 0)) &&
          (iVar2 = Abc_ObjIsBarBuf(pAVar6), iVar2 == 0)) && (local_74 != 0)) {
        pGate = (Mio_Gate_t *)(pAVar6->field_5).pData;
        iVar2 = Mio_GateReadValue((Mio_Gate_t *)(pAVar6->field_5).pData);
        Mio_GateSetValue(pGate,iVar2 + 1);
        pSop._4_4_ = pSop._4_4_ + 1;
        pAVar6 = Abc_NtkFetchTwinNode(pAVar6);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          local_74 = local_74 + 1;
        }
      }
    }
    local_78 = 5;
    for (local_74 = 0; local_74 < iVar1; local_74 = local_74 + 1) {
      iVar2 = Mio_GateReadValue(ppMVar5[local_74]);
      if (iVar2 != 0) {
        pcVar7 = Mio_GateReadName(ppMVar5[local_74]);
        sVar8 = strlen(pcVar7);
        local_78 = Abc_MaxInt(local_78,(int)sVar8);
      }
    }
    dVar10 = Abc_NtkGetMappedArea(pNtk);
    for (local_74 = 0; local_74 < iVar1; local_74 = local_74 + 1) {
      uVar3 = Mio_GateReadValue(ppMVar5[local_74]);
      if (uVar3 != 0) {
        dVar11 = Mio_GateReadArea(ppMVar5[local_74]);
        pcVar7 = Mio_GateReadName(ppMVar5[local_74]);
        uVar4 = Mio_GateReadPinNum(ppMVar5[local_74]);
        pcVar9 = Mio_GateReadForm(ppMVar5[local_74]);
        printf("%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%    %s\n",
               (double)(int)uVar3 * dVar11,((double)(int)uVar3 * dVar11 * 100.0) / dVar10,
               (ulong)local_78,pcVar7,(ulong)uVar4,(ulong)uVar3,pcVar9);
      }
    }
    printf("%-*s                Instance = %8d   Area = %10.2f   %6.2f %%\n",dVar10,
           0x4059000000000000,(ulong)local_78,"TOTAL",(ulong)pSop._4_4_);
  }
  return;
}

Assistant:

void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary )
{
    Abc_Obj_t * pObj;
    int fHasBdds, i;
    int CountConst, CountBuf, CountInv, CountAnd, CountOr, CountOther, CounterTotal;
    char * pSop;

    if ( fUseLibrary && Abc_NtkHasMapping(pNtk) )
    {
        Mio_Gate_t ** ppGates;
        double Area, AreaTotal;
        int Counter, nGates, i, nGateNameLen;

        // clean value of all gates
        nGates = Mio_LibraryReadGateNum( (Mio_Library_t *)pNtk->pManFunc );
        ppGates = Mio_LibraryReadGateArray( (Mio_Library_t *)pNtk->pManFunc );
        for ( i = 0; i < nGates; i++ )
            Mio_GateSetValue( ppGates[i], 0 );

        // count the gates by name
        CounterTotal = 0;
        Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        {
            if ( i == 0 ) continue;
            Mio_GateSetValue( (Mio_Gate_t *)pObj->pData, 1 + Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
            CounterTotal++;
            // assuming that twin gates follow each other
            if ( Abc_NtkFetchTwinNode(pObj) )
                i++;
        }

        // determine the longest gate name
        nGateNameLen = 5;
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            nGateNameLen = Abc_MaxInt( nGateNameLen, strlen(Mio_GateReadName(ppGates[i])) );
        }

        // print the gates
        AreaTotal = Abc_NtkGetMappedArea(pNtk);
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            Area = Counter * Mio_GateReadArea( ppGates[i] );
            printf( "%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%    %s\n",
                nGateNameLen, Mio_GateReadName( ppGates[i] ),
                Mio_GateReadPinNum( ppGates[i] ),
                Counter, Area, 100.0 * Area / AreaTotal,
                Mio_GateReadForm(ppGates[i]) );
        }
        printf( "%-*s                Instance = %8d   Area = %10.2f   %6.2f %%\n",
            nGateNameLen, "TOTAL",
            CounterTotal, AreaTotal, 100.0 );
        return;
    }

    if ( Abc_NtkIsAigLogic(pNtk) )
        return;

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkPrintGates(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // get hold of the SOP of the node
    CountConst = CountBuf = CountInv = CountAnd = CountOr = CountOther = CounterTotal = 0;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        if ( Abc_NtkHasMapping(pNtk) )
            pSop = Mio_GateReadSop((Mio_Gate_t *)pObj->pData);
        else
            pSop = (char *)pObj->pData;
        // collect the stats
        if ( Abc_SopIsConst0(pSop) || Abc_SopIsConst1(pSop) )
            CountConst++;
        else if ( Abc_SopIsBuf(pSop) )
            CountBuf++;
        else if ( Abc_SopIsInv(pSop) )
            CountInv++;
        else if ( (!Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  ( Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountAnd++;
        else if ( ( Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  (!Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountOr++;
        else
            CountOther++;
        CounterTotal++;
    }
    printf( "Const        = %8d    %6.2f %%\n", CountConst  ,  100.0 * CountConst   / CounterTotal );
    printf( "Buffer       = %8d    %6.2f %%\n", CountBuf    ,  100.0 * CountBuf     / CounterTotal );
    printf( "Inverter     = %8d    %6.2f %%\n", CountInv    ,  100.0 * CountInv     / CounterTotal );
    printf( "And          = %8d    %6.2f %%\n", CountAnd    ,  100.0 * CountAnd     / CounterTotal );
    printf( "Or           = %8d    %6.2f %%\n", CountOr     ,  100.0 * CountOr      / CounterTotal );
    printf( "Other        = %8d    %6.2f %%\n", CountOther  ,  100.0 * CountOther   / CounterTotal );
    printf( "TOTAL        = %8d    %6.2f %%\n", CounterTotal,  100.0 * CounterTotal / CounterTotal );

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}